

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  long lVar2;
  string *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  string *in_RDX;
  ulong in_RSI;
  string *in_RDI;
  string origStr;
  size_t copyBegin;
  size_t i;
  string local_50 [32];
  ulong local_30;
  long local_28;
  string *local_20;
  ulong local_18;
  string *local_10;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = std::__cxx11::string::find(in_RDI,in_RSI);
  if (local_28 == -1) {
    local_1 = 0;
  }
  else {
    local_30 = 0;
    std::__cxx11::string::string(local_50,local_10);
    std::__cxx11::string::clear();
    psVar3 = local_10;
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)psVar3);
    do {
      std::__cxx11::string::append(local_10,(ulong)local_50,local_30);
      std::__cxx11::string::operator+=(local_10,local_20);
      lVar2 = local_28;
      lVar4 = std::__cxx11::string::size();
      local_30 = lVar2 + lVar4;
      uVar5 = std::__cxx11::string::size();
      if ((ulong)(lVar2 + lVar4) < uVar5) {
        local_28 = std::__cxx11::string::find(local_50,local_18);
      }
      else {
        local_28 = -1;
      }
      uVar5 = local_30;
    } while (local_28 != -1);
    uVar6 = std::__cxx11::string::size();
    uVar1 = local_30;
    if (uVar5 < uVar6) {
      std::__cxx11::string::size();
      std::__cxx11::string::append(local_10,(ulong)local_50,uVar1);
    }
    local_1 = 1;
    std::__cxx11::string::~string(local_50);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        std::size_t i = str.find( replaceThis );
        if (i == std::string::npos) {
            return false;
        }
        std::size_t copyBegin = 0;
        std::string origStr = CATCH_MOVE(str);
        str.clear();
        // There is at least one replacement, so reserve with the best guess
        // we can make without actually counting the number of occurences.
        str.reserve(origStr.size() - replaceThis.size() + withThis.size());
        do {
            str.append(origStr, copyBegin, i-copyBegin );
            str += withThis;
            copyBegin = i + replaceThis.size();
            if( copyBegin < origStr.size() )
                i = origStr.find( replaceThis, copyBegin );
            else
                i = std::string::npos;
        } while( i != std::string::npos );
        if ( copyBegin < origStr.size() ) {
            str.append(origStr, copyBegin, origStr.size() );
        }
        return true;
    }